

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O2

CBData * __thiscall asmjit::CodeBuilder::newDataNode(CodeBuilder *this,void *data,uint32_t size)

{
  uint8_t *puVar1;
  CBData *pCVar2;
  uint8_t *__dest;
  ulong size_00;
  size_t local_30;
  
  size_00 = (ulong)size;
  __dest = (uint8_t *)data;
  if (0x14 < size) {
    puVar1 = (this->_cbDataZone)._end;
    __dest = (this->_cbDataZone)._ptr;
    if ((ulong)((long)puVar1 - (long)__dest) < size_00) {
      __dest = (uint8_t *)Zone::_alloc(&this->_cbDataZone,size_00);
    }
    else {
      (this->_cbDataZone)._ptr = __dest + size_00;
      if (puVar1 < __dest + size_00) {
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/../base/zone.h"
                   ,0x9b,"_ptr <= _end");
      }
    }
    if (__dest == (uint8_t *)0x0) {
      return (CBData *)0x0;
    }
    if (data != (void *)0x0) {
      memcpy(__dest,data,size_00);
    }
  }
  if ((this->_cbHeap)._zone != (Zone *)0x0) {
    pCVar2 = (CBData *)ZoneHeap::_alloc(&this->_cbHeap,0x40,&local_30);
    (pCVar2->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar2->super_CBNode)._next = (CBNode *)0x0;
    (pCVar2->super_CBNode)._type = '\x02';
    (pCVar2->super_CBNode)._opCount = '\0';
    (pCVar2->super_CBNode)._flags = (uint16_t)this->_nodeFlags;
    (pCVar2->super_CBNode)._position = this->_position;
    (pCVar2->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar2->super_CBNode)._passData = (void *)0x0;
    if (size < 0x15) {
      if (__dest != (uint8_t *)0x0) {
        memcpy(&pCVar2->field_0,__dest,size_00);
      }
    }
    else {
      *(uint8_t **)&pCVar2->field_0 = __dest;
    }
    (pCVar2->field_0).field_0._size = size;
    return pCVar2;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/../base/zone.h"
             ,0x183,"isInitialized()");
}

Assistant:

CBData* CodeBuilder::newDataNode(const void* data, uint32_t size) noexcept {
  if (size > CBData::kInlineBufferSize) {
    void* cloned = _cbDataZone.alloc(size);
    if (!cloned) return nullptr;

    if (data) ::memcpy(cloned, data, size);
    data = cloned;
  }

  return newNodeT<CBData>(const_cast<void*>(data), size);
}